

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_sampled_image_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t image_id,
          uint32_t samp_id)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar3;
  SPIRType *pSVar4;
  char *op;
  VariableID local_78;
  VariableID local_74;
  string local_70;
  string local_40 [32];
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t samp_id_local;
  uint32_t image_id_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_20 = samp_id;
  local_1c = image_id;
  samp_id_local = result_id;
  image_id_local = result_type;
  _result_id_local = this;
  if ((((this->options).vulkan_semantics & 1U) == 0) ||
     (bVar3 = VectorView<spirv_cross::CombinedImageSampler>::empty
                        (&(this->super_Compiler).combined_image_samplers.
                          super_VectorView<spirv_cross::CombinedImageSampler>),
     result_type_00 = image_id_local, result_id_00 = samp_id_local, uVar2 = local_1c,
     uVar1 = local_20, !bVar3)) {
    uVar2 = image_id_local;
    uVar1 = samp_id_local;
    TypedID<(spirv_cross::Types)2>::TypedID(&local_74,local_1c);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_78,local_20);
    to_combined_image_sampler_abi_cxx11_(&local_70,this,local_74,local_78);
    emit_op(this,uVar2,uVar1,&local_70,true,true);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,image_id_local);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_40,this,pSVar4,(ulong)samp_id_local);
    op = (char *)::std::__cxx11::string::c_str();
    emit_binary_func_op(this,result_type_00,result_id_00,uVar2,uVar1,op);
    ::std::__cxx11::string::~string(local_40);
  }
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::erase(&(this->super_Compiler).forwarded_temporaries,&samp_id_local);
  return;
}

Assistant:

void CompilerGLSL::emit_sampled_image_op(uint32_t result_type, uint32_t result_id, uint32_t image_id, uint32_t samp_id)
{
	if (options.vulkan_semantics && combined_image_samplers.empty())
	{
		emit_binary_func_op(result_type, result_id, image_id, samp_id,
		                    type_to_glsl(get<SPIRType>(result_type), result_id).c_str());
	}
	else
	{
		// Make sure to suppress usage tracking. It is illegal to create temporaries of opaque types.
		emit_op(result_type, result_id, to_combined_image_sampler(image_id, samp_id), true, true);
	}

	// Make sure to suppress usage tracking and any expression invalidation.
	// It is illegal to create temporaries of opaque types.
	forwarded_temporaries.erase(result_id);
}